

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string_view __thiscall
google::protobuf::Reflection::GetRepeatedStringViewImpl
          (Reflection *this,Message *message,FieldDescriptor *field,int index,ScratchSpace *scratch)

{
  bool bVar1;
  int number;
  CppStringType CVar2;
  ExtensionSet *this_00;
  string *this_01;
  LogMessage *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string_view sVar4;
  LogMessage local_60;
  Voidify local_49;
  Cord *local_48;
  Cord *cord;
  ScratchSpace *scratch_local;
  FieldDescriptor *pFStack_30;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  cord = (Cord *)scratch;
  scratch_local._4_4_ = index;
  pFStack_30 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(pFStack_30);
    this_01 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                        (this_00,number,scratch_local._4_4_);
    _this_local = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
  }
  else {
    CVar2 = FieldDescriptor::cpp_string_type(pFStack_30);
    if (CVar2 != kView) {
      if (CVar2 == kCord) {
        local_48 = GetRepeatedField<absl::lts_20250127::Cord>
                             (this,(Message *)field_local,pFStack_30,scratch_local._4_4_);
        if (cord != (Cord *)0x0) {
          sVar4 = ScratchSpace::CopyFromCord((ScratchSpace *)cord,local_48);
          return sVar4;
        }
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x89b,"scratch");
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_60);
      }
      if (CVar2 != kString) {
        internal::Unreachable
                  ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x8a2);
      }
    }
    this_02 = GetRepeatedPtrField<std::__cxx11::string>
                        (this,(Message *)field_local,pFStack_30,scratch_local._4_4_);
    _this_local = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_02);
  }
  return _this_local;
}

Assistant:

absl::string_view Reflection::GetRepeatedStringViewImpl(
    const Message& message, const FieldDescriptor* field, int index,
    ScratchSpace* scratch) const {
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  }

  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      auto& cord = GetRepeatedField<absl::Cord>(message, field, index);
      ABSL_DCHECK(scratch);
      return scratch->CopyFromCord(cord);
    }
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString:
      return GetRepeatedPtrField<std::string>(message, field, index);
  }
  internal::Unreachable();
}